

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rotating_endec_filter.hxx
# Opt level: O3

bool __thiscall
cryptox::
rotating_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
::filter(rotating_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>,_rotation_key_provider>
         *this,char **src_begin,char *src_end,char **dest_begin,char *dest_end,bool must_flush)

{
  bool bVar1;
  int iVar2;
  EVP_CIPHER *pEVar3;
  char *pcVar4;
  
  if (this->_period != 0) {
    pcVar4 = *src_begin;
    do {
      pEVar3 = EVP_aes_256_cbc();
      iVar2 = EVP_CIPHER_get_block_size(pEVar3);
      if ((ulong)((long)src_end - (long)pcVar4) <= (ulong)(long)iVar2) break;
      pcVar4 = *src_begin;
      pEVar3 = EVP_aes_256_cbc();
      iVar2 = EVP_CIPHER_get_block_size(pEVar3);
      bVar1 = basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
              ::filter(&this->
                        super_basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
                       ,src_begin,pcVar4 + iVar2,dest_begin,dest_end,false);
      pcVar4 = *src_begin;
      if ((((this->
            super_basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
            )._endec._M_ptr)->
          super_basic_endec<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
          ).
          super_evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
          ._total_output == this->_period) {
        rotate(this);
      }
    } while (bVar1);
    if (must_flush) {
      rotate(this);
    }
  }
  bVar1 = basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>::
          filter(&this->
                  super_basic_endec_filter<cryptox::decryptor<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>_>_>
                 ,src_begin,src_end,dest_begin,dest_end,must_flush);
  return bVar1;
}

Assistant:

bool filter(const char*& src_begin, const char* src_end, char*& dest_begin, char* dest_end, bool must_flush) {
			size_t  input_size = std::distance( src_begin,  src_end);
			size_t output_size = std::distance(dest_begin, dest_end);

			// TODO: Separate this class into encryptor and decryptor filters.
			//       For now, just if-it.
			if (_period != 0 && detail::is_encryptor<Endec>::value) {
				size_t  input_size = std::distance( src_begin,  src_end);
				size_t output_size = std::distance(dest_begin, dest_end);

				const size_t b0 =  this->total_input()               / _period;
				const size_t b1 = (this->total_input() + input_size) / _period;

				// Block change?
				if (b0 != b1) {
					int loop = 0;

					size_t left = _period - (this->total_input() % _period);
					size_t available_input = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(input_size, left);

					bool done = false;
					while (!done && left > 0 && available_input > 0) {
						done = !base_type::filter(src_begin, src_begin + available_input, dest_begin, dest_end, false);
						left -= available_input;

						 input_size = std::distance( src_begin,  src_end);
						output_size = std::distance(dest_begin, dest_end);
						available_input = std::min BOOST_PREVENT_MACRO_SUBSTITUTION(input_size, left);
					}

					rotate();

					return true;
				}
			}

			// TODO: Separate this class into encryptor and decryptor filters.
			//       For now, just if-it.
			if (_period != 0 && detail::is_decryptor<Endec>::value) {
				bool done = false;
				while (!done && input_size > Endec::algorithm_type::block_size()) {
					// FIXME: Only consuming one block at a time.

					done = !base_type::filter(src_begin, src_begin + Endec::algorithm_type::block_size(), dest_begin, dest_end, false);
					input_size = std::distance(src_begin, src_end);

					if (this->_endec->total_output() == _period)
						rotate();
				}

				if (must_flush)
					rotate();
			}

			 input_size = std::distance( src_begin,  src_end);
			output_size = std::distance(dest_begin, dest_end);

			return base_type::filter(src_begin, src_end, dest_begin, dest_end, must_flush);
		}